

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O0

void __thiscall
TPZTransfer<std::complex<float>_>::ExpandDoubleValueEntries
          (TPZTransfer<std::complex<float>_> *this,int num)

{
  int iVar1;
  int64_t iVar2;
  int in_ESI;
  long in_RDI;
  int nextsize;
  int64_t in_stack_00000038;
  TPZManVector<std::complex<float>,_10> *in_stack_00000040;
  int64_t in_stack_00000048;
  TPZManVector<std::complex<float>,_10> *in_stack_00000050;
  
  iVar1 = *(int *)(in_RDI + 0x308);
  iVar2 = TPZVec<std::complex<float>_>::NAlloc((TPZVec<std::complex<float>_> *)(in_RDI + 0x298));
  if (iVar2 < iVar1 + in_ESI) {
    TPZVec<std::complex<float>_>::NAlloc((TPZVec<std::complex<float>_> *)(in_RDI + 0x298));
    TPZManVector<std::complex<float>,_10>::Expand(in_stack_00000040,in_stack_00000038);
  }
  TPZVec<std::complex<float>_>::NElements((TPZVec<std::complex<float>_> *)(in_RDI + 0x298));
  TPZManVector<std::complex<float>,_10>::Resize(in_stack_00000050,in_stack_00000048);
  return;
}

Assistant:

void TPZTransfer<TVar>::ExpandDoubleValueEntries(int num){
	if(fDoubleValLastUsed+num > fDoubleValues.NAlloc()) {
		fDoubleValues.Expand(fDoubleValues.NAlloc()+4000);
		//    Print("After the double value expansion");
	}
	int nextsize = fDoubleValues.NElements()+num;
	fDoubleValues.Resize(nextsize);
}